

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute *a,xml_node *parent,
          xpath_allocator *alloc)

{
  xml_attribute *pxVar1;
  bool bVar2;
  xpath_node local_68;
  xpath_node local_58;
  xpath_node local_48;
  char_t *local_38;
  char_t *name;
  xpath_allocator *alloc_local;
  xml_node *parent_local;
  xml_attribute *a_local;
  xpath_node_set_raw *ns_local;
  xpath_ast_node *this_local;
  
  name = (char_t *)alloc;
  alloc_local = (xpath_allocator *)parent;
  parent_local = (xml_node *)a;
  a_local = (xml_attribute *)ns;
  ns_local = (xpath_node_set_raw *)this;
  bVar2 = xml_attribute::operator!(a);
  if (!bVar2) {
    local_38 = xml_attribute::name((xml_attribute *)parent_local);
    bVar2 = starts_with(local_38,"xmlns");
    pxVar1 = a_local;
    if ((!bVar2) || ((local_38[5] != '\0' && (local_38[5] != ':')))) {
      switch(this->_test) {
      case '\x01':
        bVar2 = strequal(local_38,(this->_data).string);
        pxVar1 = a_local;
        if (bVar2) {
          xpath_node::xpath_node(&local_48,(xml_attribute *)parent_local,(xml_node *)alloc_local);
          xpath_node_set_raw::push_back
                    ((xpath_node_set_raw *)pxVar1,&local_48,(xpath_allocator *)name);
        }
        break;
      case '\x02':
      case '\a':
        xpath_node::xpath_node(&local_58,(xml_attribute *)parent_local,(xml_node *)alloc_local);
        xpath_node_set_raw::push_back
                  ((xpath_node_set_raw *)pxVar1,&local_58,(xpath_allocator *)name);
        break;
      default:
        break;
      case '\b':
        bVar2 = starts_with(local_38,(this->_data).string);
        pxVar1 = a_local;
        if (bVar2) {
          xpath_node::xpath_node(&local_68,(xml_attribute *)parent_local,(xml_node *)alloc_local);
          xpath_node_set_raw::push_back
                    ((xpath_node_set_raw *)pxVar1,&local_68,(xpath_allocator *)name);
        }
      }
    }
  }
  return;
}

Assistant:

void step_push(xpath_node_set_raw& ns, const xml_attribute& a, const xml_node& parent, xpath_allocator* alloc)
		{
			if (!a) return;

			const char_t* name = a.name();

			// There are no attribute nodes corresponding to attributes that declare namespaces
			// That is, "xmlns:..." or "xmlns"
			if (starts_with(name, PUGIXML_TEXT("xmlns")) && (name[5] == 0 || name[5] == ':')) return;
			
			switch (_test)
			{
			case nodetest_name:
				if (strequal(name, _data.nodetest)) ns.push_back(xpath_node(a, parent), alloc);
				break;
				
			case nodetest_type_node:
			case nodetest_all:
				ns.push_back(xpath_node(a, parent), alloc);
				break;
				
			case nodetest_all_in_namespace:
				if (starts_with(name, _data.nodetest))
					ns.push_back(xpath_node(a, parent), alloc);
				break;
			
			default:
				;
			}
		}